

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void __thiscall
bloaty::ReadDWARFPubNames(bloaty *this,InfoReader *reader,string_view section,RangeSink *sink)

{
  bool bVar1;
  uint64_t offset;
  string_view name;
  CompilationUnitSizes sizes;
  string_view unit;
  CU cu;
  CUIter iter;
  CompilationUnitSizes local_13c;
  basic_string_view<char,_std::char_traits<char>_> local_138;
  RangeSink *local_128;
  string_view local_120;
  string_view local_110;
  CU local_100;
  CUIter local_48;
  
  local_128 = (RangeSink *)section._M_str;
  local_120._M_str = (char *)section._M_len;
  local_120._M_len = (size_t)reader;
  while ((InfoReader *)local_120._M_len != (InfoReader *)0x0) {
    local_138._M_len = local_120._M_len;
    local_138._M_str = local_120._M_str;
    local_110 = dwarf::CompilationUnitSizes::ReadInitialLength(&local_13c,&local_120);
    local_138 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_138,0,
                           (size_type)
                           (local_110._M_str + (local_110._M_len - (long)local_138._M_str)));
    local_13c.dwarf_version_ = ReadFixed<unsigned_short,2ul>(&local_110);
    offset = dwarf::CompilationUnitSizes::ReadDWARFOffset(&local_13c,&local_110);
    dwarf::InfoReader::GetCUIter(&local_48,(InfoReader *)this,kDebugInfo,offset);
    local_100.data_._M_len = 0;
    local_100.data_._M_str = (char *)0x0;
    local_100.entire_unit_._M_len = 0;
    local_100.entire_unit_._M_str = (char *)0x0;
    local_100.unit_name_._M_dataplus._M_p = (pointer)&local_100.unit_name_.field_2;
    local_100.unit_name_._M_string_length = 0;
    local_100.unit_name_.field_2._M_local_buf[0] = '\0';
    local_100.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
    local_100.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
    local_100.range_lists_base_ = 0;
    local_100.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_100.addr_base_ = 0;
    local_100.str_offsets_base_ = 0;
    local_100.strp_callback_._M_invoker = (_Invoker_type)0x0;
    bVar1 = dwarf::CUIter::NextCU(&local_48,(InfoReader *)this,&local_100);
    if ((bVar1) && (local_100.unit_name_._M_string_length != 0)) {
      name._M_str = local_100.unit_name_._M_dataplus._M_p;
      name._M_len = local_100.unit_name_._M_string_length;
      RangeSink::AddFileRange(local_128,"dwarf_pubnames",name,local_138);
    }
    dwarf::CU::~CU(&local_100);
  }
  return;
}

Assistant:

static void ReadDWARFPubNames(dwarf::InfoReader& reader, string_view section,
                              RangeSink* sink) {
  string_view remaining = section;

  while (remaining.size() > 0) {
    dwarf::CompilationUnitSizes sizes;
    string_view full_unit = remaining;
    string_view unit = sizes.ReadInitialLength(&remaining);
    full_unit =
        full_unit.substr(0, unit.size() + (unit.data() - full_unit.data()));
    sizes.ReadDWARFVersion(&unit);
    uint64_t debug_info_offset = sizes.ReadDWARFOffset(&unit);

    dwarf::CUIter iter = reader.GetCUIter(
        dwarf::InfoReader::Section::kDebugInfo, debug_info_offset);
    dwarf::CU cu;
    if (iter.NextCU(reader, &cu) && !cu.unit_name().empty()) {
      sink->AddFileRange("dwarf_pubnames", cu.unit_name(), full_unit);
    }
  }
}